

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlmder1c.c
# Opt level: O1

int fcn(void *p,int m,int n,double *x,double *fvec,double *fjac,int ldfjac,int iflag)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (iflag != 0) {
    if (iflag == 2) {
      iVar4 = 0xf;
      uVar5 = 0;
      do {
        uVar1 = uVar5 + 1;
        dVar6 = (double)(int)uVar1;
        dVar8 = (double)iVar4;
        if (uVar5 < 8) {
          dVar8 = dVar6;
        }
        dVar7 = (double)iVar4 * x[1] + x[2] * dVar8;
        dVar7 = dVar7 * dVar7;
        fjac[uVar5] = -1.0;
        fjac[(long)ldfjac + uVar5] = (double)((int)uVar1 * iVar4) / dVar7;
        fjac[(long)(ldfjac * 2) + uVar5] = (dVar6 * dVar8) / dVar7;
        iVar4 = iVar4 + -1;
        uVar5 = uVar1;
      } while (uVar1 != 0xf);
    }
    else {
      lVar2 = *(long *)((long)p + 8);
      lVar3 = 0xf;
      uVar5 = 0;
      do {
        dVar6 = (double)(int)(uVar5 + 1);
        dVar8 = (double)(int)lVar3;
        if (uVar5 < 8) {
          dVar8 = dVar6;
        }
        fvec[uVar5] = *(double *)(lVar2 + uVar5 * 8) -
                      (dVar6 / ((double)(int)lVar3 * x[1] + dVar8 * x[2]) + *x);
        lVar3 = lVar3 + -1;
        uVar5 = uVar5 + 1;
      } while (lVar3 != 0);
    }
  }
  return 0;
}

Assistant:

int fcn(void *p, int m, int n, const real *x, real *fvec, real *fjac, 
	 int ldfjac, int iflag)
{

/*      subroutine fcn for lmder1 example. */

  int i;
  real tmp1, tmp2, tmp3, tmp4;
  const real *y = ((fcndata_t*)p)->y;
  assert(m == 15 && n == 3);

  if (iflag == 0) {
    /*      insert print statements here when nprint is positive. */
    /* if the nprint parameter to lmder is positive, the function is
       called every nprint iterations with iflag=0, so that the
       function may perform special operations, such as printing
       residuals. */
    return 0;
  }

  if (iflag != 2) {
    /* compute residuals */
    for (i=0; i < 15; ++i) {
      tmp1 = i + 1;
      tmp2 = 15 - i;
      tmp3 = (i > 7) ? tmp2 : tmp1;
      fvec[i] = y[i] - (x[0] + tmp1/(x[1]*tmp2 + x[2]*tmp3));
    }
  } else {
    /* compute Jacobian */
    for (i=0; i<15; ++i) {
      tmp1 = i + 1;
      tmp2 = 15 - i;
      tmp3 = (i > 7) ? tmp2 : tmp1;
      tmp4 = (x[1]*tmp2 + x[2]*tmp3); tmp4 = tmp4*tmp4;
      fjac[i + ldfjac*0] = -1.;
      fjac[i + ldfjac*1] = tmp1*tmp2/tmp4;
      fjac[i + ldfjac*2] = tmp1*tmp3/tmp4;
    };
  }
  return 0;
}